

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_chr.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  string query_path_00;
  string reference_path_00;
  string chrom_size_path_00;
  string id_00;
  int *m_chr_00;
  int *NI_00;
  int *n_chr_00;
  bool bVar2;
  int iVar3;
  int m;
  int iVar4;
  ostream *poVar5;
  double **ppdVar6;
  double *pdVar7;
  long *plVar8;
  double *pdVar9;
  double *pdVar10;
  int k;
  long lVar11;
  int i_3;
  ulong uVar12;
  ulong uVar13;
  double **__args_5;
  double **__args_2;
  int i;
  long lVar14;
  ulong uVar15;
  undefined8 in_stack_fffffffffffffdd8;
  thread *this;
  double dVar16;
  undefined4 uStack_218;
  int scale;
  double **local_210;
  int *m_chr;
  double *eta_chr;
  int *NI;
  int *n_chr;
  string id;
  string resultpath;
  string local_190;
  string thread_mode;
  string chrom_size_path;
  string reference_path;
  string query_path;
  string local_f0;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_67ef);
  if (argc < 7) {
    std::operator<<((ostream *)&std::cout,
                    "Usage:\n\tistat <QUERY_INTERVALS_FILE> <REFERENCE_INTERVALS_FILE> <CHROMOSOME_SIZES_FILE>\n\t<SCALING_FACTOR> <OUTPUT_FILE> <THREADING_MODE>\n\nDescription:\n\tComputes the p-value of overlap between query and reference intervals.\n"
                   );
    iVar3 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&query_path,argv[1],(allocator *)&reference_path);
    std::__cxx11::string::string((string *)&reference_path,argv[2],(allocator *)&chrom_size_path);
    std::__cxx11::string::string((string *)&chrom_size_path,argv[3],(allocator *)&resultpath);
    std::__cxx11::string::string((string *)&resultpath,argv[4],(allocator *)&thread_mode);
    iVar3 = std::__cxx11::stoi(&resultpath,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&resultpath);
    scale = iVar3;
    std::__cxx11::string::string((string *)&resultpath,argv[5],(allocator *)&thread_mode);
    std::__cxx11::string::string((string *)&thread_mode,argv[6],(allocator *)&id);
    poVar5 = std::operator<<((ostream *)&std::cout,"scale is ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,scale);
    std::endl<char,std::char_traits<char>>(poVar5);
    ppdVar6 = (double **)operator_new__(200);
    for (lVar14 = 0; lVar14 != 0x19; lVar14 = lVar14 + 1) {
      pdVar7 = (double *)operator_new__(800000);
      ppdVar6[lVar14] = pdVar7;
      for (lVar11 = 0; lVar11 != 100000; lVar11 = lVar11 + 1) {
        pdVar7[lVar11] = 0.0;
      }
    }
    local_210 = (double **)operator_new__(200);
    for (lVar14 = 0; lVar14 != 0x19; lVar14 = lVar14 + 1) {
      pdVar7 = (double *)operator_new__(800000);
      local_210[lVar14] = pdVar7;
      for (lVar11 = 0; lVar11 != 100000; lVar11 = lVar11 + 1) {
        pdVar7[lVar11] = -1.0;
      }
    }
    n_chr = (int *)operator_new__(100);
    m_chr = (int *)operator_new__(100);
    NI = (int *)operator_new__(100);
    eta_chr = (double *)operator_new__(200);
    plVar8 = (long *)operator_new__(200);
    *plVar8 = 0x18;
    this = (thread *)(plVar8 + 1);
    memset(this,0,0xc0);
    bVar2 = std::operator==(&thread_mode,"p");
    if (bVar2) {
      lVar14 = 0;
      __args_5 = ppdVar6;
      __args_2 = local_210;
      while( true ) {
        __args_2 = __args_2 + 1;
        __args_5 = __args_5 + 1;
        if (lVar14 == 0x18) break;
        id._M_dataplus._M_p = (pointer)&id.field_2;
        id._M_string_length = 0;
        id.field_2._M_local_buf[0] = '\0';
        iVar3 = (int)lVar14;
        if ((iVar3 == 0x17) || (iVar3 == 0x16)) {
          std::__cxx11::string::assign((char *)&id);
        }
        else {
          std::__cxx11::to_string(&local_190,iVar3 + 1);
          std::operator+(&local_50,"chr",&local_190);
          std::__cxx11::string::operator=((string *)&id,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_190);
        }
        local_190._M_dataplus._M_p._0_4_ = iVar3 + 1;
        std::thread::
        thread<void(&)(int*,int*,double*,int*,double*,double*,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string,int),int*&,int*&,double*&,int*&,double*&,double*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int,std::__cxx11::string&,int&,void>
                  ((thread *)&local_50,call_from_thread,&n_chr,&m_chr,__args_2,&NI,&eta_chr,__args_5
                   ,&query_path,&reference_path,&chrom_size_path,(int *)&local_190,&id,&scale);
        std::thread::operator=(this,(thread *)&local_50);
        std::thread::~thread((thread *)&local_50);
        std::__cxx11::string::~string((string *)&id);
        this = this + 1;
        lVar14 = lVar14 + 1;
      }
      for (lVar14 = 8; lVar14 != 200; lVar14 = lVar14 + 8) {
        std::thread::join();
      }
    }
    else {
      for (lVar14 = 1; lVar14 != 0x19; lVar14 = lVar14 + 1) {
        id._M_dataplus._M_p = (pointer)&id.field_2;
        id._M_string_length = 0;
        id.field_2._M_local_buf[0] = '\0';
        iVar3 = (int)lVar14;
        if ((iVar3 == 0x18) || (iVar3 == 0x17)) {
          std::__cxx11::string::assign((char *)&id);
        }
        else {
          std::__cxx11::to_string(&local_190,iVar3);
          std::operator+(&local_50,"chr",&local_190);
          std::__cxx11::string::operator=((string *)&id,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_190);
        }
        n_chr_00 = n_chr;
        NI_00 = NI;
        pdVar10 = eta_chr;
        m_chr_00 = m_chr;
        pdVar7 = local_210[lVar14];
        pdVar9 = ppdVar6[lVar14];
        std::__cxx11::string::string(local_70,(string *)&query_path);
        std::__cxx11::string::string(local_90,(string *)&reference_path);
        std::__cxx11::string::string(local_b0,(string *)&chrom_size_path);
        std::__cxx11::string::string(local_d0,(string *)&id);
        query_path_00._M_string_length = (size_type)local_90;
        query_path_00._M_dataplus._M_p = (pointer)local_70;
        query_path_00.field_2._M_allocated_capacity = (size_type)local_b0;
        query_path_00.field_2._8_8_ = lVar14;
        reference_path_00._M_string_length._0_4_ = scale;
        reference_path_00._M_dataplus._M_p = (pointer)local_d0;
        reference_path_00._M_string_length._4_4_ = 0;
        reference_path_00.field_2._M_allocated_capacity = in_stack_fffffffffffffdd8;
        reference_path_00.field_2._8_8_ = lVar14;
        chrom_size_path_00._M_dataplus._M_p._4_4_ = scale;
        chrom_size_path_00._M_dataplus._M_p._0_4_ = uStack_218;
        chrom_size_path_00._M_string_length = (size_type)local_210;
        chrom_size_path_00.field_2._M_allocated_capacity = (size_type)m_chr;
        chrom_size_path_00.field_2._8_8_ = eta_chr;
        id_00._M_string_length = (size_type)id._M_dataplus._M_p;
        id_00._M_dataplus._M_p = (pointer)n_chr;
        id_00.field_2._M_allocated_capacity = id._M_string_length;
        id_00.field_2._M_local_buf[8] = id.field_2._M_local_buf[0];
        id_00.field_2._9_7_ = id.field_2._M_allocated_capacity._1_7_;
        chrom(n_chr_00,m_chr_00,pdVar7,NI_00,pdVar10,pdVar9,query_path_00,reference_path_00,
              chrom_size_path_00,(int)NI,id_00,id.field_2._8_4_);
        std::__cxx11::string::~string(local_d0);
        std::__cxx11::string::~string(local_b0);
        std::__cxx11::string::~string(local_90);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string((string *)&id);
      }
    }
    iVar3 = sum(n_chr,0x18);
    m = sum(m_chr,0x18);
    iVar4 = sum(NI,0x18);
    poVar5 = std::operator<<((ostream *)&std::cout,"Number of query intervals (n) is ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,"Number of reference intervals (m) is ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,m);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,"Overlap is ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    std::endl<char,std::char_traits<char>>(poVar5);
    pdVar7 = std::__min_element<double*,__gnu_cxx::__ops::_Iter_less_iter>
                       (eta_chr + 1,eta_chr + 0x19);
    dVar16 = *pdVar7;
    std::operator<<((ostream *)&std::cout,"eta is ");
    poVar5 = std::ostream::_M_insert<double>(dVar16);
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar15 = 0xffffffffffffffff;
    if (-2 < m) {
      uVar15 = (ulong)(m + 1) << 3;
    }
    pdVar7 = (double *)operator_new__(uVar15);
    combine_chr(pdVar7,m,0x18,m_chr,local_210);
    std::operator<<((ostream *)&std::cout,"DP p-value is ");
    poVar5 = std::ostream::_M_insert<double>(pdVar7[iVar4]);
    std::endl<char,std::char_traits<char>>(poVar5);
    pdVar9 = (double *)operator_new__(uVar15);
    iVar3 = 0;
    for (lVar14 = 1; lVar14 != 0x19; lVar14 = lVar14 + 1) {
      uVar1 = m_chr[lVar14];
      uVar12 = 0;
      if (0 < (int)uVar1) {
        uVar12 = (ulong)uVar1;
      }
      for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
        pdVar9[(long)iVar3 + uVar13 + 1] = ppdVar6[lVar14][uVar13 + 1];
      }
      iVar3 = iVar3 + uVar1;
    }
    pdVar10 = (double *)operator_new__(uVar15);
    poisbinom(pdVar10,pdVar9,m);
    std::operator<<((ostream *)&std::cout,"PB p-value is ");
    poVar5 = std::ostream::_M_insert<double>(pdVar10[iVar4]);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::string((string *)&local_f0,(string *)&resultpath);
    write2file(&local_f0,pdVar7,pdVar10,m);
    std::__cxx11::string::~string((string *)&local_f0);
    for (lVar14 = 0; lVar14 != 0x19; lVar14 = lVar14 + 1) {
      if (ppdVar6[lVar14] != (double *)0x0) {
        operator_delete__(ppdVar6[lVar14]);
      }
    }
    operator_delete__(ppdVar6);
    for (lVar14 = 0; lVar14 != 0x19; lVar14 = lVar14 + 1) {
      if (local_210[lVar14] != (double *)0x0) {
        operator_delete__(local_210[lVar14]);
      }
    }
    operator_delete__(local_210);
    if (n_chr != (int *)0x0) {
      operator_delete__(n_chr);
    }
    if (m_chr != (int *)0x0) {
      operator_delete__(m_chr);
    }
    if (NI != (int *)0x0) {
      operator_delete__(NI);
    }
    if (eta_chr != (double *)0x0) {
      operator_delete__(eta_chr);
    }
    if (*plVar8 != 0) {
      lVar14 = *plVar8 << 3;
      do {
        std::thread::~thread((thread *)((long)plVar8 + lVar14));
        lVar14 = lVar14 + -8;
      } while (lVar14 != 0);
    }
    operator_delete__(plVar8);
    operator_delete__(pdVar7);
    operator_delete__(pdVar9);
    operator_delete__(pdVar10);
    std::__cxx11::string::~string((string *)&thread_mode);
    std::__cxx11::string::~string((string *)&resultpath);
    std::__cxx11::string::~string((string *)&chrom_size_path);
    std::__cxx11::string::~string((string *)&reference_path);
    std::__cxx11::string::~string((string *)&query_path);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int main(int argc, char** argv)
{
    cout << HEADER;

    if (argc < 7)
    {
        cout << USAGE;
        return 1;
    }
    string query_path = argv[1];
    string reference_path = argv[2];
    string chrom_size_path = argv[3];
    int scale = stoi(argv[4]);
    string resultpath = argv[5];
    string thread_mode = argv[6];
    int num_chr = 24;
    cout << "scale is " << scale << endl;
    int max_m_chr = 100000;
    double** Pj;
    Pj = new double* [num_chr+1];
    for(int i=0; i<=num_chr; i++)
    {
        Pj[i] = new double [max_m_chr];
        for(int k=0; k<max_m_chr; k++)
        {
            Pj[i][k] = 0;
        }
    }

    double** NM; //log scale
    NM = new double* [num_chr+1];
    for(int i=0; i<=num_chr; i++)
    {
        NM[i] = new double [max_m_chr];
        for(int k=0; k<max_m_chr; k++)
            {
                NM[i][k] = -1;
            }
    }

    int* n_chr = new int [num_chr+1];
    int* m_chr = new int [num_chr+1];
    int* NI = new int [num_chr+1];
    double* eta_chr = new double [num_chr+1];

    thread *th = new thread [num_chr];

    if (thread_mode=="p")
    {//Mltithreading
        for(int i=0; i<num_chr; i++)
        {
            string id;
            if (i+1==23)
                id = "chrX";
            else if (i+1==24)
                id = "chrY";
            else
                id = "chr" + to_string(i+1);
            th[i] = thread(call_from_thread, n_chr, m_chr, NM[i+1], NI, eta_chr, Pj[i+1],
                           query_path, reference_path, chrom_size_path, i+1, id, scale);
        }
        for(int i=0; i<num_chr; i++)
        {
            th[i].join();
        }
    }
    else
    {// Single thread
        for(int i=1; i<=num_chr; i++)
        {
            string id;
            if (i==23)
                id = "chrX";
            else if (i==24)
                id = "chrY";
            else
                id = "chr" + to_string(i);
            chrom(n_chr, m_chr, NM[i], NI, eta_chr, Pj[i], query_path, reference_path, chrom_size_path,
                          i, id, scale);
        }
    }
    // int job_id[8] = {0, 1, 2, 3, 4, 5, 6, num_chr-1};
    // for (int j=0; j<num_chr/8; j++)
    // {
    //     for(auto i: job_id)
    //     {
    //         string id;
    //         if (i+1==23)
    //             id = "chrX";
    //         else if (i+1==24)
    //             id = "chrY";
    //         else
    //             id = "chr" + to_string(i+1);
    //         th[i] = thread(call_from_thread, n_chr, m_chr, NM[i+1], NI, Pj[i+1],
    //                        query_path, reference_path, chrom_size_path, i+1, id, scale);
    //     }
    //     for(auto i: job_id)
    //     {
    //         th[i].join();
    //     }
    //     job_id[0] += 7;
    //     job_id[1] += 7;
    //     job_id[2] += 7;
    //     job_id[3] += 7;
    //     job_id[4] += 7;
    //     job_id[5] += 7;
    //     job_id[6] += 7;
    //     job_id[7]--;
    // }

    int n = sum(n_chr, num_chr);
    int m = sum(m_chr, num_chr);
    int N_intersect = sum(NI, num_chr);
    cout << "Number of query intervals (n) is " << n << endl;
    cout << "Number of reference intervals (m) is " << m << endl;
    cout << "Overlap is " << N_intersect << endl;

    // int mid = num_chr/2;
    // nth_element(eta_chr+1, eta_chr+1+mid, eta_chr+num_chr+1);
    // double eta = eta_chr[1+mid];
    double eta = *min_element(eta_chr+1, eta_chr+num_chr+1);
    cout << "eta is " << eta << endl;

    double* p_value_dp = new double [m+1];
    combine_chr(p_value_dp, m, num_chr, m_chr, NM);
    cout << "DP p-value is " << p_value_dp[N_intersect] << endl;

    double* p = new double [m+1];
    int idx = 0;
    for(int i=1; i<=num_chr; i++)
    {
      for(int k=1; k<=m_chr[i]; k++)
      {
        p[idx+k] = Pj[i][k];
      }
      idx += m_chr[i];
    }
    double* p_value_poisbinom = new double [m+1];
    poisbinom(p_value_poisbinom, p, m);
    cout << "PB p-value is " << p_value_poisbinom[N_intersect] << endl;

    // write2file(resultpath, p_value_dp, p_value_poisbinom, m);
    write2file(resultpath, p_value_dp, p_value_poisbinom, m);

    for(int i=0; i<=num_chr; i++)
    {
        delete [] Pj[i];
    }
    delete [] Pj;
    for(int i=0; i<=num_chr; i++)
    {
        delete [] NM[i];
    }
    delete [] NM;
    delete [] n_chr;
    delete [] m_chr;
    delete [] NI;
    delete [] eta_chr;
    delete [] th;
    delete [] p_value_dp;
    delete [] p;
    delete [] p_value_poisbinom;
    return 0;
}